

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::Gemm_x86_avx::create_pipeline_int8(Gemm_x86_avx *this,Option *opt)

{
  Mat *A;
  undefined1 auVar1 [16];
  void *pvVar2;
  Allocator *pAVar3;
  size_t sVar4;
  uint max_ii;
  uint max_kk;
  Option *pOVar5;
  undefined1 (*pauVar6) [16];
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  undefined1 (*pauVar11) [16];
  int *piVar12;
  int iVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  undefined1 *puVar30;
  long lVar31;
  undefined1 *puVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  undefined8 *puVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ulong local_1c0;
  long local_1a8;
  long local_188;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat *local_160;
  long local_158;
  undefined8 local_150;
  ulong local_148;
  uint local_13c;
  Option *local_138;
  Mat local_130;
  ulong local_e8;
  uint local_e0;
  uint local_dc;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_138 = opt;
  if ((this->super_Gemm).constantA == 0) {
LAB_004cea21:
    if ((this->super_Gemm).constantB != 0) {
      uVar9 = (this->super_Gemm).constantN;
      uVar33 = (this->super_Gemm).constantK;
      uVar17 = (ulong)uVar33;
      get_optimal_tile_mnk_int8
                (0,uVar9,uVar33,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,local_138->num_threads);
      local_13c = (int)(uVar9 + TILE_N + -1) / TILE_N;
      uVar19 = (ulong)(uint)TILE_K;
      local_b8 = (ulong)uVar9;
      Mat::create(&this->BT_data,TILE_N * TILE_K,(int)(TILE_K + uVar33 + -1) / TILE_K,local_13c,1,
                  (Allocator *)0x0);
      if (((this->BT_data).data == (void *)0x0) ||
         ((long)(this->BT_data).c * (this->BT_data).cstep == 0)) goto LAB_004cfa6c;
      if (0 < (int)local_13c) {
        local_160 = &(this->super_Gemm).B_data;
        uVar35 = 0;
        local_38 = uVar17;
        do {
          local_90 = uVar35;
          if (0 < (int)uVar17) {
            iVar13 = TILE_N * (int)uVar35;
            local_e8 = CONCAT44(local_e8._4_4_,(int)local_b8 - iVar13);
            lVar10 = (long)iVar13;
            local_98 = lVar10 + 7;
            local_a0 = lVar10 + 6;
            local_a8 = lVar10 + 5;
            local_b0 = lVar10 + 4;
            local_c8 = lVar10 + 3;
            local_d0 = lVar10 + 2;
            local_d8 = lVar10 + 1;
            iVar21 = 0;
            do {
              uVar9 = (uint)local_e8;
              if (TILE_N < (int)(uint)local_e8) {
                uVar9 = TILE_N;
              }
              uVar33 = (int)uVar17 - iVar21;
              uVar17 = (ulong)uVar33;
              if ((int)uVar19 < (int)uVar33) {
                uVar17 = uVar19;
              }
              local_130.elemsize = (this->BT_data).elemsize;
              local_130.w = (this->BT_data).w;
              local_130.cstep = (size_t)local_130.w;
              local_130.elempack = (this->BT_data).elempack;
              local_130.allocator = (this->BT_data).allocator;
              local_130.data =
                   (void *)((long)(this->BT_data).data +
                           local_130.elemsize * local_130.cstep * (long)(iVar21 / (int)uVar19) +
                           (long)(iVar13 / TILE_N) * (this->BT_data).cstep * local_130.elemsize);
              local_130.refcount = (int *)0x0;
              local_130.dims = 2;
              local_130.h = 1;
              local_130.d = 1;
              local_130.c = 1;
              uVar7 = (uint)uVar17;
              if ((this->super_Gemm).transB == 0) {
                iVar23 = cpu_support_x86_avx_vnni_int8();
                if (iVar23 == 0) {
                  iVar23 = cpu_support_x86_avx_vnni();
                  if (iVar23 == 0) {
                    iVar23 = cpu_support_x86_avx2();
                    if (iVar23 == 0) {
                      iVar23 = (this->super_Gemm).B_data.w;
                      lVar14 = (long)iVar23;
                      uVar17 = 0;
                      pauVar11 = (undefined1 (*) [16])local_130.data;
                      if (7 < (int)uVar9) {
                        lVar18 = lVar10 + lVar14;
                        lVar20 = lVar10;
                        uVar19 = 0;
                        do {
                          pvVar2 = (this->super_Gemm).B_data.data;
                          lVar22 = (long)(this->super_Gemm).B_data.w * (long)iVar21 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar7 < 2) {
                            lVar34 = (long)pvVar2 + lVar10 + uVar19;
                            uVar33 = 0;
                          }
                          else {
                            lVar34 = (long)pvVar2 + lVar20;
                            lVar26 = (long)pvVar2 + lVar18;
                            iVar8 = 1;
                            do {
                              auVar41._8_8_ = 0;
                              auVar41._0_8_ = *(ulong *)(lVar34 + lVar22);
                              auVar42._8_8_ = 0;
                              auVar42._0_8_ = *(ulong *)(lVar26 + lVar22);
                              auVar41 = vpunpcklbw_avx(auVar41,auVar42);
                              *pauVar11 = auVar41;
                              pauVar11 = pauVar11 + 1;
                              lVar34 = lVar34 + iVar23 * 2;
                              lVar26 = lVar26 + iVar23 * 2;
                              iVar8 = iVar8 + 2;
                              uVar33 = uVar7 & 0xfffffffe;
                            } while (iVar8 < (int)uVar7);
                          }
                          puVar39 = (undefined8 *)(lVar34 + lVar22);
                          iVar8 = uVar7 - uVar33;
                          if (iVar8 != 0 && (int)uVar33 <= (int)uVar7) {
                            do {
                              *(undefined8 *)*pauVar11 = *puVar39;
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 8);
                              puVar39 = (undefined8 *)((long)puVar39 + lVar14);
                              iVar8 = iVar8 + -1;
                            } while (iVar8 != 0);
                          }
                          uVar17 = uVar19 + 8;
                          uVar35 = uVar19 + 0xf;
                          lVar20 = lVar20 + 8;
                          lVar18 = lVar18 + 8;
                          uVar19 = uVar17;
                        } while (uVar35 < uVar9);
                      }
                      if ((int)((uint)uVar17 | 3) < (int)uVar9) {
                        lVar26 = (long)(iVar23 * 2);
                        lVar18 = lVar10 + (uVar17 & 0xffffffff);
                        lVar22 = (iVar23 + 3) + lVar18;
                        lVar34 = (iVar23 + 2) + lVar18;
                        lVar37 = (iVar23 + 1) + lVar18;
                        lVar20 = lVar18 + lVar14;
                        uVar19 = uVar17 & 0xffffffff;
                        do {
                          pvVar2 = (this->super_Gemm).B_data.data;
                          lVar36 = (long)(this->super_Gemm).B_data.w * (long)iVar21 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar7 < 2) {
                            lVar25 = (long)pvVar2 + lVar10 + uVar19;
                            uVar33 = 0;
                          }
                          else {
                            lVar25 = lVar18 + (long)pvVar2;
                            lVar27 = lVar22 + (long)pvVar2;
                            lVar28 = lVar34 + (long)pvVar2;
                            lVar38 = lVar37 + (long)pvVar2;
                            lVar31 = (long)pvVar2 + lVar20;
                            iVar8 = 1;
                            do {
                              (*pauVar11)[0] = *(undefined1 *)(lVar25 + lVar36);
                              (*pauVar11)[1] = *(undefined1 *)(lVar31 + lVar36);
                              (*pauVar11)[2] = *(undefined1 *)(lVar25 + 1 + lVar36);
                              (*pauVar11)[3] = *(undefined1 *)(lVar38 + lVar36);
                              (*pauVar11)[4] = *(undefined1 *)(lVar25 + 2 + lVar36);
                              (*pauVar11)[5] = *(undefined1 *)(lVar28 + lVar36);
                              (*pauVar11)[6] = *(undefined1 *)(lVar25 + 3 + lVar36);
                              (*pauVar11)[7] = *(undefined1 *)(lVar27 + lVar36);
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 8);
                              iVar8 = iVar8 + 2;
                              lVar25 = lVar25 + lVar26;
                              lVar27 = lVar27 + lVar26;
                              lVar28 = lVar28 + lVar26;
                              lVar38 = lVar38 + lVar26;
                              lVar31 = lVar31 + lVar26;
                            } while (iVar8 < (int)uVar7);
                            uVar33 = uVar7 & 0xfffffffe;
                          }
                          iVar8 = uVar7 - uVar33;
                          if (iVar8 != 0 && (int)uVar33 <= (int)uVar7) {
                            puVar30 = (undefined1 *)(lVar25 + lVar36 + 3);
                            do {
                              (*pauVar11)[0] = puVar30[-3];
                              (*pauVar11)[1] = puVar30[-2];
                              (*pauVar11)[2] = puVar30[-1];
                              (*pauVar11)[3] = *puVar30;
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 4);
                              puVar30 = puVar30 + lVar14;
                              iVar8 = iVar8 + -1;
                            } while (iVar8 != 0);
                          }
                          uVar17 = uVar19 + 4;
                          lVar36 = uVar19 + 7;
                          lVar18 = lVar18 + 4;
                          lVar22 = lVar22 + 4;
                          lVar34 = lVar34 + 4;
                          lVar37 = lVar37 + 4;
                          lVar20 = lVar20 + 4;
                          uVar19 = uVar17;
                        } while (lVar36 < (int)uVar9);
                      }
                      if ((int)((uint)uVar17 | 1) < (int)uVar9) {
                        lVar34 = (long)(iVar23 * 2);
                        lVar18 = lVar10 + (uVar17 & 0xffffffff);
                        lVar22 = (iVar23 + 1) + lVar18;
                        lVar20 = lVar18 + lVar14;
                        uVar19 = uVar17 & 0xffffffff;
                        do {
                          pvVar2 = (this->super_Gemm).B_data.data;
                          lVar26 = (long)(this->super_Gemm).B_data.w * (long)iVar21 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar7 < 2) {
                            lVar37 = (long)pvVar2 + lVar10 + uVar19;
                            uVar33 = 0;
                          }
                          else {
                            lVar37 = (long)pvVar2 + lVar18;
                            lVar36 = (long)pvVar2 + lVar22;
                            lVar25 = (long)pvVar2 + lVar20;
                            iVar23 = 1;
                            do {
                              (*pauVar11)[0] = *(undefined1 *)(lVar37 + lVar26);
                              (*pauVar11)[1] = *(undefined1 *)(lVar25 + lVar26);
                              (*pauVar11)[2] = *(undefined1 *)(lVar37 + 1 + lVar26);
                              (*pauVar11)[3] = *(undefined1 *)(lVar36 + lVar26);
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 4);
                              iVar23 = iVar23 + 2;
                              lVar37 = lVar37 + lVar34;
                              lVar36 = lVar36 + lVar34;
                              lVar25 = lVar25 + lVar34;
                              uVar33 = uVar7 & 0xfffffffe;
                            } while (iVar23 < (int)uVar7);
                          }
                          iVar23 = uVar7 - uVar33;
                          if (iVar23 != 0 && (int)uVar33 <= (int)uVar7) {
                            puVar30 = (undefined1 *)(lVar37 + lVar26 + 1);
                            do {
                              (*pauVar11)[0] = puVar30[-1];
                              (*pauVar11)[1] = *puVar30;
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 2);
                              puVar30 = puVar30 + lVar14;
                              iVar23 = iVar23 + -1;
                            } while (iVar23 != 0);
                          }
                          uVar17 = uVar19 + 2;
                          lVar26 = uVar19 + 3;
                          lVar18 = lVar18 + 2;
                          lVar22 = lVar22 + 2;
                          lVar20 = lVar20 + 2;
                          uVar19 = uVar17;
                        } while (lVar26 < (int)uVar9);
                      }
                      if ((int)uVar17 < (int)uVar9) {
                        lVar18 = (long)(int)uVar17;
                        do {
                          if (0 < (int)uVar7) {
                            puVar30 = (undefined1 *)
                                      ((long)(this->super_Gemm).B_data.data +
                                      lVar10 + lVar18 +
                                      (long)(this->super_Gemm).B_data.w * (long)iVar21 *
                                      (this->super_Gemm).B_data.elemsize);
                            uVar33 = uVar7;
                            do {
                              (*pauVar11)[0] = *puVar30;
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 1);
                              puVar30 = puVar30 + lVar14;
                              uVar33 = uVar33 - 1;
                            } while (uVar33 != 0);
                          }
                          lVar18 = lVar18 + 1;
                        } while (lVar18 != (int)uVar9);
                      }
                    }
                    else {
                      transpose_pack_B_tile_int8_avx2
                                (local_160,&local_130,iVar13,uVar9,iVar21,uVar7);
                    }
                  }
                  else {
                    transpose_pack_B_tile_int8_avxvnni
                              (local_160,&local_130,iVar13,uVar9,iVar21,uVar7);
                  }
                }
                else {
                  transpose_pack_B_tile_int8_avxvnniint8
                            (local_160,&local_130,iVar13,uVar9,iVar21,uVar7);
                }
              }
              else {
                local_dc = uVar33;
                local_40 = uVar19;
                iVar23 = cpu_support_x86_avx_vnni_int8();
                if (iVar23 == 0) {
                  iVar23 = cpu_support_x86_avx_vnni();
                  if (iVar23 == 0) {
                    iVar23 = cpu_support_x86_avx2();
                    if (iVar23 == 0) {
                      uVar17 = 0;
                      pauVar11 = (undefined1 (*) [16])local_130.data;
                      if (7 < (int)uVar9) {
                        local_48 = (long)iVar21;
                        local_e0 = uVar7 & 0xfffffffe;
                        local_50 = (ulong)uVar9;
                        local_c0 = local_b0;
                        local_1c0 = 0;
                        lVar14 = local_a8;
                        lVar18 = local_c8;
                        lVar20 = local_d0;
                        lVar22 = local_d8;
                        uVar19 = local_a0;
                        lVar34 = lVar10;
                        uVar35 = local_98;
                        do {
                          local_148 = uVar35;
                          local_150 = uVar19;
                          lVar26 = (long)(this->super_Gemm).B_data.w;
                          sVar4 = (this->super_Gemm).B_data.elemsize;
                          lVar37 = (long)(this->super_Gemm).B_data.data + local_48;
                          if ((int)uVar7 < 2) {
                            lVar26 = sVar4 * lVar26;
                            lVar27 = (local_1c0 + lVar10) * lVar26 + lVar37;
                            lVar38 = (local_1c0 + lVar10 + 1) * lVar26 + lVar37;
                            lVar36 = (local_1c0 + lVar10 + 2) * lVar26 + lVar37;
                            lVar28 = (local_1c0 + lVar10 + 3) * lVar26 + lVar37;
                            lVar25 = (local_1c0 + lVar10 + 4) * lVar26 + lVar37;
                            lVar31 = (local_1c0 + lVar10 + 5) * lVar26 + lVar37;
                            local_158 = (local_1c0 + lVar10 + 6) * lVar26 + lVar37;
                            local_188 = (lVar10 + local_1c0 + 7) * lVar26 + lVar37;
                            uVar33 = 0;
                          }
                          else {
                            local_188 = sVar4 * local_148 * lVar26;
                            lVar36 = lVar37 + local_188;
                            local_158 = sVar4 * local_150 * lVar26;
                            lVar25 = lVar37 + local_158;
                            local_70 = sVar4 * lVar14 * lVar26;
                            local_68 = sVar4 * local_c0 * lVar26;
                            local_60 = sVar4 * lVar18 * lVar26;
                            local_88 = sVar4 * lVar20 * lVar26;
                            local_58 = sVar4 * lVar22 * lVar26;
                            local_80 = sVar4 * lVar34 * lVar26;
                            lVar26 = 0;
                            pauVar6 = pauVar11;
                            do {
                              pauVar15 = pauVar6;
                              puVar30 = *pauVar11 + lVar26 * 8;
                              *puVar30 = *(undefined1 *)(lVar37 + local_80 + lVar26);
                              puVar30[1] = *(undefined1 *)(lVar37 + local_80 + 1 + lVar26);
                              puVar30[2] = *(undefined1 *)(local_58 + lVar37 + lVar26);
                              puVar30[3] = *(undefined1 *)(local_58 + lVar37 + 1 + lVar26);
                              puVar30[4] = *(undefined1 *)(lVar37 + local_88 + lVar26);
                              puVar30[5] = *(undefined1 *)(lVar37 + local_88 + 1 + lVar26);
                              puVar30[6] = *(undefined1 *)(lVar37 + local_60 + lVar26);
                              puVar30[7] = *(undefined1 *)(lVar37 + local_60 + 1 + lVar26);
                              puVar30[8] = *(undefined1 *)(lVar37 + local_68 + lVar26);
                              puVar30[9] = *(undefined1 *)(lVar37 + local_68 + 1 + lVar26);
                              puVar30[10] = *(undefined1 *)(lVar37 + local_70 + lVar26);
                              puVar30[0xb] = *(undefined1 *)(lVar37 + local_70 + 1 + lVar26);
                              puVar30[0xc] = *(undefined1 *)(lVar25 + lVar26);
                              puVar30[0xd] = *(undefined1 *)(lVar25 + 1 + lVar26);
                              puVar30[0xe] = *(undefined1 *)(lVar36 + lVar26);
                              puVar30[0xf] = *(undefined1 *)(lVar36 + 1 + lVar26);
                              lVar27 = lVar26 + 2;
                              iVar23 = (int)lVar26;
                              lVar26 = lVar27;
                              pauVar6 = (undefined1 (*) [16])(puVar30 + 0x10);
                            } while (iVar23 + 3 < (int)uVar7);
                            pauVar11 = pauVar15 + 1;
                            lVar27 = lVar37 + lVar27;
                            local_188 = local_188 + lVar27;
                            local_158 = local_158 + lVar27;
                            lVar31 = local_70 + lVar27;
                            lVar25 = local_68 + lVar27;
                            lVar28 = local_60 + lVar27;
                            lVar36 = local_88 + lVar27;
                            lVar38 = local_58 + lVar27;
                            lVar27 = lVar27 + local_80;
                            uVar33 = local_e0;
                            local_78 = lVar37;
                          }
                          if ((int)uVar33 < (int)uVar7) {
                            lVar26 = 0;
                            do {
                              (*pauVar11)[0] = *(undefined1 *)(lVar27 + lVar26);
                              (*pauVar11)[1] = *(undefined1 *)(lVar38 + lVar26);
                              (*pauVar11)[2] = *(undefined1 *)(lVar36 + lVar26);
                              (*pauVar11)[3] = *(undefined1 *)(lVar28 + lVar26);
                              (*pauVar11)[4] = *(undefined1 *)(lVar25 + lVar26);
                              (*pauVar11)[5] = *(undefined1 *)(lVar31 + lVar26);
                              (*pauVar11)[6] = *(undefined1 *)(local_158 + lVar26);
                              (*pauVar11)[7] = *(undefined1 *)(local_188 + lVar26);
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 8);
                              lVar26 = lVar26 + 1;
                            } while (uVar7 - uVar33 != (int)lVar26);
                          }
                          uVar17 = local_1c0 + 8;
                          uVar29 = local_1c0 + 0xf;
                          lVar14 = lVar14 + 8;
                          local_c0 = local_c0 + 8;
                          lVar18 = lVar18 + 8;
                          lVar20 = lVar20 + 8;
                          lVar22 = lVar22 + 8;
                          lVar34 = lVar34 + 8;
                          uVar19 = local_150 + 8;
                          uVar35 = local_148 + 8;
                          local_1c0 = uVar17;
                        } while (uVar29 < local_50);
                      }
                      if ((int)((uint)uVar17 | 3) < (int)uVar9) {
                        local_150 = CONCAT44(local_150._4_4_,uVar7) & 0xfffffffffffffffe;
                        uVar19 = uVar17 & 0xffffffff;
                        local_148 = (ulong)(int)uVar9;
                        lVar14 = local_c8 + uVar19;
                        lVar18 = local_d0 + uVar19;
                        lVar20 = local_d8 + uVar19;
                        local_1a8 = lVar10 + uVar19;
                        do {
                          lVar22 = (long)(this->super_Gemm).B_data.w;
                          sVar4 = (this->super_Gemm).B_data.elemsize;
                          pvVar2 = (this->super_Gemm).B_data.data;
                          if ((int)uVar7 < 2) {
                            lVar22 = sVar4 * lVar22;
                            lVar34 = (uVar19 + lVar10) * lVar22 + (long)iVar21;
                            lVar26 = (lVar10 + uVar19 + 1) * lVar22 + (long)iVar21;
                            lVar37 = (lVar10 + uVar19 + 2) * lVar22 + (long)iVar21;
                            lVar36 = (uVar19 + lVar10 + 3) * lVar22 + (long)iVar21;
                            iVar23 = 0;
                          }
                          else {
                            lVar36 = sVar4 * lVar14 * lVar22;
                            lVar25 = lVar36 + iVar21;
                            lVar37 = sVar4 * lVar18 * lVar22;
                            lVar27 = lVar37 + iVar21;
                            lVar26 = sVar4 * lVar20 * lVar22;
                            lVar28 = lVar26 + iVar21;
                            lVar22 = sVar4 * local_1a8 * lVar22;
                            lVar31 = lVar22 + iVar21;
                            pauVar6 = pauVar11;
                            lVar38 = 0;
                            do {
                              pauVar15 = pauVar6;
                              puVar30 = *pauVar11 + lVar38 * 4;
                              *puVar30 = *(undefined1 *)((long)pvVar2 + lVar38 + lVar31);
                              puVar30[1] = *(undefined1 *)((long)pvVar2 + lVar38 + lVar31 + 1);
                              puVar30[2] = *(undefined1 *)((long)pvVar2 + lVar38 + lVar28);
                              puVar30[3] = *(undefined1 *)((long)pvVar2 + lVar38 + lVar28 + 1);
                              puVar30[4] = *(undefined1 *)((long)pvVar2 + lVar38 + lVar27);
                              puVar30[5] = *(undefined1 *)((long)pvVar2 + lVar38 + lVar27 + 1);
                              puVar30[6] = *(undefined1 *)((long)pvVar2 + lVar38 + lVar25);
                              puVar30[7] = *(undefined1 *)((long)pvVar2 + lVar38 + lVar25 + 1);
                              lVar34 = lVar38 + 2;
                              iVar23 = (int)lVar38;
                              pauVar6 = (undefined1 (*) [16])(puVar30 + 8);
                              lVar38 = lVar34;
                            } while (iVar23 + 3 < (int)uVar7);
                            pauVar11 = (undefined1 (*) [16])(*pauVar15 + 8);
                            lVar34 = lVar34 + iVar21;
                            lVar36 = lVar36 + lVar34;
                            lVar37 = lVar37 + lVar34;
                            lVar26 = lVar26 + lVar34;
                            lVar34 = lVar22 + lVar34;
                            iVar23 = (int)local_150;
                          }
                          if (iVar23 < (int)uVar7) {
                            lVar22 = 0;
                            do {
                              (*pauVar11)[0] = *(undefined1 *)((long)pvVar2 + lVar22 + lVar34);
                              (*pauVar11)[1] = *(undefined1 *)((long)pvVar2 + lVar22 + lVar26);
                              (*pauVar11)[2] = *(undefined1 *)((long)pvVar2 + lVar22 + lVar37);
                              (*pauVar11)[3] = *(undefined1 *)((long)pvVar2 + lVar22 + lVar36);
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 4);
                              lVar22 = lVar22 + 1;
                            } while (uVar7 - iVar23 != (int)lVar22);
                          }
                          uVar17 = uVar19 + 4;
                          lVar22 = uVar19 + 7;
                          lVar14 = lVar14 + 4;
                          lVar18 = lVar18 + 4;
                          lVar20 = lVar20 + 4;
                          local_1a8 = local_1a8 + 4;
                          uVar19 = uVar17;
                        } while (lVar22 < (long)local_148);
                      }
                      if ((int)((uint)uVar17 | 1) < (int)uVar9) {
                        uVar19 = uVar17 & 0xffffffff;
                        do {
                          lVar14 = (long)(this->super_Gemm).B_data.w *
                                   (this->super_Gemm).B_data.elemsize;
                          pvVar2 = (this->super_Gemm).B_data.data;
                          puVar30 = (undefined1 *)
                                    ((long)pvVar2 + (uVar19 + lVar10) * lVar14 + (long)iVar21);
                          puVar32 = (undefined1 *)
                                    ((long)pvVar2 + (lVar10 + uVar19 + 1) * lVar14 + (long)iVar21);
                          uVar33 = 0;
                          if (1 < (int)uVar7) {
                            iVar23 = 1;
                            do {
                              (*pauVar11)[0] = *puVar30;
                              (*pauVar11)[1] = puVar30[1];
                              (*pauVar11)[2] = *puVar32;
                              (*pauVar11)[3] = puVar32[1];
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 4);
                              puVar30 = puVar30 + 2;
                              puVar32 = puVar32 + 2;
                              iVar23 = iVar23 + 2;
                              uVar33 = uVar7 & 0xfffffffe;
                            } while (iVar23 < (int)uVar7);
                          }
                          if ((int)uVar33 < (int)uVar7) {
                            lVar14 = 0;
                            do {
                              (*pauVar11)[0] = puVar30[lVar14];
                              (*pauVar11)[1] = puVar32[lVar14];
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 2);
                              lVar14 = lVar14 + 1;
                            } while (uVar7 - uVar33 != (int)lVar14);
                          }
                          uVar17 = uVar19 + 2;
                          lVar14 = uVar19 + 3;
                          uVar19 = uVar17;
                        } while (lVar14 < (int)uVar9);
                      }
                      if ((int)uVar17 < (int)uVar9) {
                        lVar14 = (long)(int)uVar17;
                        uVar33 = local_dc;
                        if ((int)(uint)local_40 < (int)local_dc) {
                          uVar33 = (uint)local_40;
                        }
                        lVar18 = lVar10 + lVar14;
                        do {
                          if (0 < (int)uVar7) {
                            iVar23 = (this->super_Gemm).B_data.w;
                            pvVar2 = (this->super_Gemm).B_data.data;
                            sVar4 = (this->super_Gemm).B_data.elemsize;
                            lVar20 = 0;
                            do {
                              (*pauVar11)[lVar20] =
                                   *(undefined1 *)
                                    ((long)pvVar2 +
                                    lVar20 + sVar4 * lVar18 * (long)iVar23 + (long)iVar21);
                              lVar20 = lVar20 + 1;
                            } while (uVar33 != (uint)lVar20);
                            pauVar11 = (undefined1 (*) [16])(*pauVar11 + lVar20);
                          }
                          lVar14 = lVar14 + 1;
                          lVar18 = lVar18 + 1;
                        } while (lVar14 != (int)uVar9);
                      }
                    }
                    else {
                      pack_B_tile_int8_avx2(local_160,&local_130,iVar13,uVar9,iVar21,uVar7);
                    }
                  }
                  else {
                    pack_B_tile_int8_avxvnni(local_160,&local_130,iVar13,uVar9,iVar21,uVar7);
                  }
                }
                else {
                  pack_B_tile_int8_avxvnniint8(local_160,&local_130,iVar13,uVar9,iVar21,uVar7);
                }
              }
              uVar17 = local_38;
              if (local_130.refcount != (int *)0x0) {
                LOCK();
                *local_130.refcount = *local_130.refcount + -1;
                UNLOCK();
                if (*local_130.refcount == 0) {
                  if (local_130.allocator == (Allocator *)0x0) {
                    if ((undefined1 (*) [16])local_130.data != (undefined1 (*) [16])0x0) {
                      free(local_130.data);
                    }
                  }
                  else {
                    (*(local_130.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              uVar19 = (ulong)(uint)TILE_K;
              iVar21 = iVar21 + TILE_K;
            } while (iVar21 < (int)uVar17);
          }
          uVar9 = (int)local_90 + 1;
          uVar35 = (ulong)uVar9;
        } while (uVar9 != local_13c);
      }
      if (local_138->lightmode != false) {
        piVar12 = (this->super_Gemm).B_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar2 = (this->super_Gemm).B_data.data;
            pAVar3 = (this->super_Gemm).B_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).B_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).B_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).B_data.data = (void *)0x0;
        (this->super_Gemm).B_data.refcount = (int *)0x0;
        (this->super_Gemm).B_data.dims = 0;
        (this->super_Gemm).B_data.w = 0;
        (this->super_Gemm).B_data.h = 0;
        (this->super_Gemm).B_data.d = 0;
        (this->super_Gemm).B_data.c = 0;
      }
    }
    pOVar5 = local_138;
    if (((this->super_Gemm).constantC != 0) && ((this->super_Gemm).constant_broadcast_type_C != -1))
    {
      piVar12 = (this->super_Gemm).C_data.refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      piVar12 = (this->CT_data).refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          pvVar2 = (this->CT_data).data;
          pAVar3 = (this->CT_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      auVar1._0_8_ = (this->super_Gemm).C_data.data;
      auVar1._8_8_ = (this->super_Gemm).C_data.refcount;
      (this->CT_data).data = (void *)auVar1._0_8_;
      (this->CT_data).refcount = (int *)auVar1._8_8_;
      (this->CT_data).elemsize = (this->super_Gemm).C_data.elemsize;
      (this->CT_data).elempack = (this->super_Gemm).C_data.elempack;
      (this->CT_data).allocator = (this->super_Gemm).C_data.allocator;
      iVar13 = (this->super_Gemm).C_data.w;
      iVar21 = (this->super_Gemm).C_data.h;
      iVar23 = (this->super_Gemm).C_data.d;
      (this->CT_data).dims = (this->super_Gemm).C_data.dims;
      (this->CT_data).w = iVar13;
      (this->CT_data).h = iVar21;
      (this->CT_data).d = iVar23;
      (this->CT_data).c = (this->super_Gemm).C_data.c;
      (this->CT_data).cstep = (this->super_Gemm).C_data.cstep;
      if (pOVar5->lightmode == true) {
        piVar12 = (int *)vpextrq_avx(auVar1,1);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar2 = (this->super_Gemm).C_data.data;
            pAVar3 = (this->super_Gemm).C_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).C_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).C_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).C_data.data = (void *)0x0;
        (this->super_Gemm).C_data.refcount = (int *)0x0;
        (this->super_Gemm).C_data.dims = 0;
        (this->super_Gemm).C_data.w = 0;
        (this->super_Gemm).C_data.h = 0;
        (this->super_Gemm).C_data.d = 0;
        (this->super_Gemm).C_data.c = 0;
      }
    }
    if ((((this->super_Gemm).constantA != 0) || ((this->super_Gemm).constantB != 0)) ||
       (iVar13 = 0, (this->super_Gemm).constantC != 0)) {
      *(int *)&(this->super_Gemm).field_0x244 = pOVar5->num_threads;
      iVar13 = 0;
    }
  }
  else {
    uVar9 = (this->super_Gemm).constantM;
    iVar13 = (this->super_Gemm).constantK;
    get_optimal_tile_mnk_int8
              (uVar9,0,iVar13,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
               (this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar21 = TILE_M;
    uVar33 = TILE_K;
    uVar7 = (int)(uVar9 + TILE_M + -1) / TILE_M;
    iVar23 = uVar33;
    local_e8 = (ulong)uVar9;
    if (3 < TILE_K) {
      iVar8 = cpu_support_x86_avx512_vnni();
      bVar40 = true;
      if (iVar8 == 0) {
        iVar8 = cpu_support_x86_avx_vnni();
        bVar40 = iVar8 != 0;
      }
      iVar8 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar40 ^ 1U | iVar8 != 0)) {
        iVar23 = 0x40;
        if (((iVar21 < 0x10) && (iVar23 = 0x20, iVar21 < 8)) && (iVar23 = 0x10, iVar21 < 4)) {
          iVar23 = (uint)(1 < iVar21) * 4 + 4;
        }
        iVar23 = iVar23 + uVar33;
      }
    }
    Mat::create(&this->AT_data,iVar23 * iVar21,(int)(iVar13 + uVar33 + -1) / (int)uVar33,uVar7,1,
                (Allocator *)0x0);
    if (((this->AT_data).data != (void *)0x0) &&
       ((long)(this->AT_data).c * (this->AT_data).cstep != 0)) {
      if (0 < (int)uVar7) {
        A = &(this->super_Gemm).A_data;
        uVar17 = 0;
        do {
          local_148 = uVar17;
          if (0 < iVar13) {
            iVar21 = TILE_M * (int)uVar17;
            uVar9 = (int)local_e8 - iVar21;
            lVar10 = (long)iVar21;
            iVar23 = 0;
            do {
              max_ii = uVar9;
              if (TILE_M < (int)uVar9) {
                max_ii = TILE_M;
              }
              max_kk = iVar13 - iVar23;
              if ((int)uVar33 < iVar13 - iVar23) {
                max_kk = uVar33;
              }
              local_130.elemsize = (this->AT_data).elemsize;
              local_130.w = (this->AT_data).w;
              local_130.cstep = (size_t)local_130.w;
              local_130.elempack = (this->AT_data).elempack;
              local_130.allocator = (this->AT_data).allocator;
              local_130.data =
                   (void *)((long)(this->AT_data).data +
                           local_130.elemsize * local_130.cstep * (long)(iVar23 / (int)uVar33) +
                           (long)(iVar21 / TILE_M) * (this->AT_data).cstep * local_130.elemsize);
              local_130.refcount = (int *)0x0;
              local_130.dims = 2;
              local_130.h = 1;
              local_130.d = 1;
              local_130.c = 1;
              if ((this->super_Gemm).transA == 0) {
                pack_A_tile_int8(A,&local_130,iVar21,max_ii,iVar23,max_kk);
              }
              else {
                iVar8 = cpu_support_x86_avx_vnni_int8();
                if (iVar8 == 0) {
                  iVar8 = cpu_support_x86_avx_vnni();
                  if (iVar8 == 0) {
                    iVar8 = cpu_support_x86_avx2();
                    if (iVar8 == 0) {
                      iVar8 = (this->super_Gemm).A_data.w;
                      lVar14 = (long)iVar8;
                      uVar17 = 0;
                      local_158 = CONCAT44(local_158._4_4_,max_ii);
                      pauVar11 = (undefined1 (*) [16])local_130.data;
                      if (3 < (int)max_ii) {
                        lVar26 = (long)(iVar8 * 2);
                        local_150 = CONCAT44(local_150._4_4_,max_kk) & 0xfffffffffffffffe;
                        local_1c0 = (iVar8 + 3) + lVar10;
                        lVar22 = (iVar8 + 2) + lVar10;
                        lVar34 = (iVar8 + 1) + lVar10;
                        lVar18 = lVar10 + lVar14;
                        lVar20 = lVar10;
                        uVar19 = 0;
                        do {
                          pvVar2 = (this->super_Gemm).A_data.data;
                          lVar37 = (long)(this->super_Gemm).A_data.w * (long)iVar23 *
                                   (this->super_Gemm).A_data.elemsize;
                          if ((int)max_kk < 2) {
                            lVar36 = (long)pvVar2 + lVar10 + uVar19;
                            iVar24 = 0;
                          }
                          else {
                            lVar36 = (long)pvVar2 + lVar20;
                            lVar25 = (long)pvVar2 + local_1c0;
                            lVar27 = (long)pvVar2 + lVar22;
                            lVar28 = (long)pvVar2 + lVar34;
                            lVar31 = (long)pvVar2 + lVar18;
                            iVar24 = 1;
                            do {
                              (*pauVar11)[0] = *(undefined1 *)(lVar36 + lVar37);
                              (*pauVar11)[1] = *(undefined1 *)(lVar31 + lVar37);
                              (*pauVar11)[2] = *(undefined1 *)(lVar36 + 1 + lVar37);
                              (*pauVar11)[3] = *(undefined1 *)(lVar28 + lVar37);
                              (*pauVar11)[4] = *(undefined1 *)(lVar36 + 2 + lVar37);
                              (*pauVar11)[5] = *(undefined1 *)(lVar27 + lVar37);
                              (*pauVar11)[6] = *(undefined1 *)(lVar36 + 3 + lVar37);
                              (*pauVar11)[7] = *(undefined1 *)(lVar25 + lVar37);
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 8);
                              iVar24 = iVar24 + 2;
                              lVar36 = lVar36 + lVar26;
                              lVar25 = lVar25 + lVar26;
                              lVar27 = lVar27 + lVar26;
                              lVar28 = lVar28 + lVar26;
                              lVar31 = lVar31 + lVar26;
                            } while (iVar24 < (int)max_kk);
                            iVar24 = (int)local_150;
                          }
                          iVar16 = max_kk - iVar24;
                          if (iVar16 != 0 && iVar24 <= (int)max_kk) {
                            puVar30 = (undefined1 *)(lVar36 + lVar37 + 3);
                            do {
                              (*pauVar11)[0] = puVar30[-3];
                              (*pauVar11)[1] = puVar30[-2];
                              (*pauVar11)[2] = puVar30[-1];
                              (*pauVar11)[3] = *puVar30;
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 4);
                              puVar30 = puVar30 + lVar14;
                              iVar16 = iVar16 + -1;
                            } while (iVar16 != 0);
                          }
                          uVar17 = uVar19 + 4;
                          uVar35 = uVar19 + 7;
                          lVar20 = lVar20 + 4;
                          local_1c0 = local_1c0 + 4;
                          lVar22 = lVar22 + 4;
                          lVar34 = lVar34 + 4;
                          lVar18 = lVar18 + 4;
                          uVar19 = uVar17;
                        } while (uVar35 < max_ii);
                      }
                      if ((int)((uint)uVar17 | 1) < (int)max_ii) {
                        lVar34 = (long)(iVar8 * 2);
                        lVar18 = lVar10 + (uVar17 & 0xffffffff);
                        lVar22 = (iVar8 + 1) + lVar18;
                        lVar20 = lVar18 + lVar14;
                        uVar19 = uVar17 & 0xffffffff;
                        do {
                          pvVar2 = (this->super_Gemm).A_data.data;
                          lVar26 = (long)(this->super_Gemm).A_data.w * (long)iVar23 *
                                   (this->super_Gemm).A_data.elemsize;
                          if ((int)max_kk < 2) {
                            lVar37 = (long)pvVar2 + lVar10 + uVar19;
                            uVar33 = 0;
                          }
                          else {
                            lVar37 = (long)pvVar2 + lVar18;
                            lVar36 = (long)pvVar2 + lVar22;
                            lVar25 = (long)pvVar2 + lVar20;
                            iVar8 = 1;
                            do {
                              (*pauVar11)[0] = *(undefined1 *)(lVar37 + lVar26);
                              (*pauVar11)[1] = *(undefined1 *)(lVar25 + lVar26);
                              (*pauVar11)[2] = *(undefined1 *)(lVar37 + 1 + lVar26);
                              (*pauVar11)[3] = *(undefined1 *)(lVar36 + lVar26);
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 4);
                              iVar8 = iVar8 + 2;
                              lVar37 = lVar37 + lVar34;
                              lVar36 = lVar36 + lVar34;
                              lVar25 = lVar25 + lVar34;
                            } while (iVar8 < (int)max_kk);
                            uVar33 = max_kk & 0xfffffffe;
                          }
                          iVar8 = max_kk - uVar33;
                          if (iVar8 != 0 && (int)uVar33 <= (int)max_kk) {
                            puVar30 = (undefined1 *)(lVar37 + lVar26 + 1);
                            do {
                              (*pauVar11)[0] = puVar30[-1];
                              (*pauVar11)[1] = *puVar30;
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 2);
                              puVar30 = puVar30 + lVar14;
                              iVar8 = iVar8 + -1;
                            } while (iVar8 != 0);
                          }
                          uVar17 = uVar19 + 2;
                          lVar26 = uVar19 + 3;
                          lVar18 = lVar18 + 2;
                          lVar22 = lVar22 + 2;
                          lVar20 = lVar20 + 2;
                          uVar19 = uVar17;
                        } while (lVar26 < (int)max_ii);
                      }
                      if ((int)uVar17 < (int)max_ii) {
                        uVar17 = uVar17 & 0xffffffff;
                        do {
                          if (0 < (int)max_kk) {
                            puVar30 = (undefined1 *)
                                      ((long)(this->super_Gemm).A_data.data +
                                      lVar10 + uVar17 +
                                      (long)(this->super_Gemm).A_data.w * (long)iVar23 *
                                      (this->super_Gemm).A_data.elemsize);
                            uVar33 = max_kk;
                            do {
                              (*pauVar11)[0] = *puVar30;
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 1);
                              puVar30 = puVar30 + lVar14;
                              uVar33 = uVar33 - 1;
                            } while (uVar33 != 0);
                          }
                          uVar17 = uVar17 + 1;
                        } while (uVar17 != max_ii);
                      }
                    }
                    else {
                      transpose_pack_A_tile_int8_avx2(A,&local_130,iVar21,max_ii,iVar23,max_kk);
                    }
                  }
                  else {
                    transpose_pack_A_tile_int8_avxvnni(A,&local_130,iVar21,max_ii,iVar23,max_kk);
                  }
                }
                else {
                  transpose_pack_A_tile_int8_avxvnniint8(A,&local_130,iVar21,max_ii,iVar23,max_kk);
                }
              }
              if (local_130.refcount != (int *)0x0) {
                LOCK();
                *local_130.refcount = *local_130.refcount + -1;
                UNLOCK();
                if (*local_130.refcount == 0) {
                  if (local_130.allocator == (Allocator *)0x0) {
                    if ((undefined1 (*) [16])local_130.data != (undefined1 (*) [16])0x0) {
                      free(local_130.data);
                    }
                  }
                  else {
                    (*(local_130.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              iVar23 = iVar23 + TILE_K;
              uVar33 = TILE_K;
            } while (iVar23 < iVar13);
          }
          uVar9 = (int)local_148 + 1;
          uVar17 = (ulong)uVar9;
        } while (uVar9 != uVar7);
      }
      if (local_138->lightmode != false) {
        piVar12 = (this->super_Gemm).A_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar2 = (this->super_Gemm).A_data.data;
            pAVar3 = (this->super_Gemm).A_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).A_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).A_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).A_data.data = (void *)0x0;
        (this->super_Gemm).A_data.refcount = (int *)0x0;
        (this->super_Gemm).A_data.dims = 0;
        (this->super_Gemm).A_data.w = 0;
        (this->super_Gemm).A_data.h = 0;
        (this->super_Gemm).A_data.d = 0;
        (this->super_Gemm).A_data.c = 0;
      }
      goto LAB_004cea21;
    }
LAB_004cfa6c:
    iVar13 = -100;
  }
  return iVar13;
}

Assistant:

int Gemm_x86_avx::create_pipeline_int8(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

#if NCNN_AVX512VNNI || NCNN_AVXVNNI
        bool has_w_shift = false;
        if (TILE_K >= 4)
        {
            has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
            if (ncnn::cpu_support_x86_avx_vnni_int8())
                has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
        }
        if (has_w_shift)
        {
            int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
            AT_data.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
        {
            AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_N; ppj++)
        {
            const int j = ppj * TILE_N;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_jj = std::min((N - j), TILE_N);
                const int max_kk = std::min((K - k), TILE_K);

                Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (transB)
                {
                    pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
                else
                {
                    transpose_pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}